

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

bool __thiscall slang::ast::Type::isCastCompatible(Type *this,Type *rhs)

{
  bool bVar1;
  Type *this_00;
  Type *rhs_00;
  bool bVar2;
  
  this_00 = getCanonicalType(this);
  rhs_00 = getCanonicalType(rhs);
  bVar1 = isAssignmentCompatible(this_00,rhs_00);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = isEnum(this_00);
    if (bVar1) {
      bVar1 = isIntegral(rhs_00);
      if (!bVar1) {
        bVar1 = isFloating(rhs_00);
        return bVar1;
      }
    }
    else {
      bVar1 = isString(this_00);
      if ((bVar1) || (bVar1 = isString(rhs_00), rhs_00 = this_00, bVar1)) {
        bVar1 = isIntegral(rhs_00);
        return bVar1;
      }
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool Type::isCastCompatible(const Type& rhs) const {
    // See [6.22.4] for Cast Compatible
    const Type* l = &getCanonicalType();
    const Type* r = &rhs.getCanonicalType();
    if (l->isAssignmentCompatible(*r))
        return true;

    if (l->isEnum())
        return r->isIntegral() || r->isFloating();

    if (l->isString())
        return r->isIntegral();

    if (r->isString())
        return l->isIntegral();

    return false;
}